

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O2

int anon_unknown.dwarf_28dc::forward_query_fn(void *extra_state,MPI_Status *status)

{
  code *pcVar1;
  undefined8 uVar2;
  int iVar3;
  WPI_StatusPtr local_10;
  
  pcVar1 = *extra_state;
  uVar2 = *(undefined8 *)((long)extra_state + 0x18);
  if (status != (MPI_Status *)0x0) {
    iVar3 = status->MPI_TAG;
    status[1].MPI_SOURCE = status->MPI_SOURCE;
    status[1].MPI_TAG = iVar3;
    status[1].MPI_ERROR = status->MPI_ERROR;
  }
  local_10.wrapped_status_ptr = (WPI_Status *)status;
  iVar3 = (*pcVar1)(uVar2);
  WPI_StatusPtr::~WPI_StatusPtr(&local_10);
  return iVar3;
}

Assistant:

int forward_query_fn(void *extra_state, MPI_Status *status) {
  const grequest_state_t *const grequest_state =
      static_cast<const grequest_state_t *>(extra_state);
  return grequest_state->query_fn(grequest_state->extra_state,
                                  (WPI_StatusPtr)status);
}